

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O3

char * vrna_filename_sanitize(char *name,char *replacement)

{
  size_t sVar1;
  void *p;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  
  uVar5 = 0;
  if (name == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar1 = strlen(name);
    p = vrna_alloc((int)sVar1 + 1);
    pcVar2 = strpbrk(name,"\\/?%*:|\"<> ");
    pcVar4 = name;
    if (pcVar2 != (char *)0x0) {
      uVar5 = 0;
      do {
        strncpy((char *)((ulong)uVar5 + (long)p),pcVar4,(long)pcVar2 - (long)pcVar4);
        uVar5 = (int)((long)pcVar2 - (long)pcVar4) + uVar5;
        if ((replacement != (char *)0x0) && (*replacement != '\0')) {
          uVar3 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          *(char *)((long)p + uVar3) = *replacement;
        }
        pcVar4 = pcVar2 + 1;
        pcVar2 = strpbrk(pcVar4,"\\/?%*:|\"<> ");
      } while (pcVar2 != (char *)0x0);
    }
    sVar1 = strlen(name);
    if (pcVar4 < name + sVar1) {
      strncpy((char *)((long)p + (ulong)uVar5),pcVar4,
              (ulong)(name + (sVar1 - (long)pcVar4)) & 0xffffffff);
      uVar5 = uVar5 + (int)(name + (sVar1 - (long)pcVar4));
    }
    pcVar4 = (char *)vrna_realloc(p,uVar5 + 1);
    pcVar4[uVar5] = '\0';
    if ((*pcVar4 == '.') && ((pcVar4[1] == '\0' || ((pcVar4[1] == '.' && (pcVar4[2] == '\0')))))) {
      pcVar4 = (char *)vrna_realloc(pcVar4,1);
      *pcVar4 = '\0';
    }
    sVar1 = strlen(pcVar4);
    if ((sVar1 & 0xffffff00) != 0) {
      pcVar2 = strrchr(pcVar4,0x2e);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = pcVar4 + ((sVar1 & 0xffffffff) - (long)pcVar2);
        if ((long)pcVar2 < 0xff) {
          memmove(pcVar4 + (0xff - (int)pcVar2),
                  pcVar4 + ((sVar1 & 0xffffffff) - ((ulong)pcVar2 & 0xffffffff)),
                  (ulong)pcVar2 & 0xffffffff);
        }
      }
      pcVar4 = (char *)vrna_realloc(pcVar4,0x100);
      pcVar4[0xff] = '\0';
    }
  }
  return pcVar4;
}

Assistant:

PUBLIC char *
vrna_filename_sanitize(const char *name,
                       const char *replacement)
{
  if (name) {
    const char    *ptr, *start, *illegal_chars;
    char          *sanitized_name;
    unsigned int  i, n;

    illegal_chars   = "\\/?%*:|\"<> ";
    sanitized_name  = (char *)vrna_alloc(sizeof(char) * (strlen(name) + 1));
    start           = name;
    i               = 0;
    while ((ptr = strpbrk(start, illegal_chars))) {
      /* find illegal chars */
      strncpy(sanitized_name + i, start, ptr - start);
      i += ptr - start;
      if (replacement && (*replacement))
        sanitized_name[i++] = *replacement;

      start = ptr + 1; /* skip invalid character */
    }
    /* copy remaining part */
    if (start < (name + strlen(name))) {
      unsigned int diff = name - start + strlen(name);
      strncpy(sanitized_name + i, start, diff);
      i += diff;
    }

    /* resize the output string to actual requirements */
    sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char) * (i + 1));
    sanitized_name[i] = '\0';

    /* check for reserved unix file names */
    if ((!strcmp(sanitized_name, ".")) || (!strcmp(sanitized_name, ".."))) {
      sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char));
      sanitized_name[0] = '\0';
    }

    /* check for length restrictions */
    n = strlen(sanitized_name);
    if (n > 255) {
      char *suff = NULL;
      /* try to leave file suffix, i.e. everything after last dot '.', intact */
      if ((suff = strrchr(sanitized_name, '.')) && (sanitized_name + n - suff < 255)) {
        unsigned int n_suff = sanitized_name + n - suff;
        memmove(sanitized_name + (255 - n_suff), sanitized_name + n - n_suff,
                sizeof(char) * n_suff);
      }

      sanitized_name      = (char *)vrna_realloc(sanitized_name, sizeof(char) * 256);
      sanitized_name[255] = '\0';
    }

    /* finally, return the sanitized file name */
    return sanitized_name;
  } else {
    return NULL;
  }
}